

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSMC.h
# Opt level: O3

void __thiscall
chrono::ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>::
CalculateJacobians(ChContactSMC<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
                   *this,ChMaterialCompositeSMC *mat)

{
  double *pdVar1;
  double *pdVar2;
  ChContactable_1vars<3> *pCVar3;
  ChContactJacobian *pCVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  ChVectorDynamic<> Q1;
  ChVectorDynamic<> Q0;
  ChStateDelta stateA_w;
  ChStateDelta stateB_w;
  ChState stateA_x;
  ChStateDelta prtrbB;
  ChStateDelta prtrbA;
  ChState stateB_x;
  ChState stateB_x1;
  ChState stateA_x1;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_138;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  ulong local_110;
  long local_108;
  ChStateDelta local_100;
  ChStateDelta local_e8;
  ChState local_d0;
  ChStateDelta local_b8;
  ChStateDelta local_a0;
  ChState local_88;
  ulong local_70;
  long local_68;
  ChState local_60;
  ChState local_48;
  
  iVar6 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>)
             .objA)->super_ChContactable)._vptr_ChContactable[3])();
  uVar7 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>)
             .objA)->super_ChContactable)._vptr_ChContactable[4])();
  ChState::ChState(&local_d0,(long)iVar6,(ChIntegrable *)0x0);
  local_108 = (long)(int)uVar7;
  local_110 = (ulong)uVar7;
  ChStateDelta::ChStateDelta(&local_100,local_108,(ChIntegrable *)0x0);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objA;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[5])(pCVar3,&local_d0);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objA;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[6])(pCVar3,&local_100);
  iVar8 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>)
             .objB)->super_ChContactable)._vptr_ChContactable[3])();
  uVar7 = (*(((this->
              super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>)
             .objB)->super_ChContactable)._vptr_ChContactable[4])();
  local_68 = (long)iVar6;
  ChState::ChState(&local_88,(long)iVar8,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_e8,(long)(int)uVar7,(ChIntegrable *)0x0);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objB;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[5])(pCVar3,&local_88);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>).
           objB;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[6])(pCVar3,&local_e8);
  lVar13 = (long)(int)((int)local_110 + uVar7);
  local_128.m_storage.m_data = (double *)0x0;
  local_128.m_storage.m_rows = 0;
  local_70 = (ulong)uVar7;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_128,lVar13);
  CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_128);
  ChState::ChState(&local_48,local_68,(ChIntegrable *)0x0);
  ChState::ChState(&local_60,(long)iVar8,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_a0,local_108,(ChIntegrable *)0x0);
  ChStateDelta::ChStateDelta(&local_b8,(long)(int)uVar7,(ChIntegrable *)0x0);
  local_138.m_storage.m_data = (double *)0x0;
  local_138.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_138,lVar13);
  if (0 < (int)local_110) {
    lVar11 = 0;
    lVar13 = 0;
    do {
      if (local_a0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar13)
      goto LAB_0056bb97;
      local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] =
           local_a0.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] +
           1e-05;
      pCVar3 = (this->
               super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
               ).objA;
      (*(pCVar3->super_ChContactable)._vptr_ChContactable[7])(pCVar3,&local_d0,&local_a0,&local_48);
      CalculateQ(this,&local_48,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_a0.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar13)
      goto LAB_0056bb97;
      local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] =
           local_a0.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0056bbb6;
      if (local_138.m_storage.m_rows < 0) goto LAB_0056bc32;
      pCVar4 = this->m_Jac;
      pdVar9 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar10 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar10 < 0 && pdVar9 != (double *)0x0) goto LAB_0056bc13;
      lVar5 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar5 <= lVar13) goto LAB_0056bbf4;
      if (lVar10 != local_138.m_storage.m_rows) goto LAB_0056bbd5;
      if (local_138.m_storage.m_rows != 0) {
        pdVar9 = (double *)((long)pdVar9 + lVar11);
        lVar10 = 0;
        do {
          pdVar1 = local_138.m_storage.m_data + lVar10;
          pdVar2 = local_128.m_storage.m_data + lVar10;
          lVar10 = lVar10 + 1;
          *pdVar9 = (*pdVar1 - *pdVar2) * -99999.99999999999;
          pdVar9 = pdVar9 + lVar5;
        } while (local_138.m_storage.m_rows != lVar10);
      }
      if (local_100.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar13)
      goto LAB_0056bb97;
      local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] =
           local_100.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] +
           1e-05;
      CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_100.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <= lVar13)
      goto LAB_0056bb97;
      local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] =
           local_100.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[lVar13] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0056bbb6;
      if (local_138.m_storage.m_rows < 0) goto LAB_0056bc32;
      pCVar4 = this->m_Jac;
      pdVar9 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar10 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar10 < 0 && pdVar9 != (double *)0x0) goto LAB_0056bc13;
      lVar5 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar5 <= lVar13) goto LAB_0056bbf4;
      if (lVar10 != local_138.m_storage.m_rows) goto LAB_0056bbd5;
      if (local_138.m_storage.m_rows != 0) {
        pdVar9 = (double *)((long)pdVar9 + lVar11);
        lVar10 = 0;
        do {
          pdVar1 = local_138.m_storage.m_data + lVar10;
          pdVar2 = local_128.m_storage.m_data + lVar10;
          lVar10 = lVar10 + 1;
          *pdVar9 = (*pdVar1 - *pdVar2) * -99999.99999999999;
          pdVar9 = pdVar9 + lVar5;
        } while (local_138.m_storage.m_rows != lVar10);
      }
      lVar13 = lVar13 + 1;
      lVar11 = lVar11 + 8;
    } while (lVar13 != local_108);
  }
  if (0 < (int)local_70) {
    local_110 = local_70 & 0xffffffff;
    uVar12 = 0;
    lVar13 = local_108 * 8;
    do {
      if (local_b8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar12) {
LAB_0056bb97:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] =
           local_b8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] +
           1e-05;
      pCVar3 = (this->
               super_ChContactTuple<chrono::ChContactable_1vars<3>,_chrono::ChContactable_1vars<3>_>
               ).objB;
      (*(pCVar3->super_ChContactable)._vptr_ChContactable[7])(pCVar3,&local_88,&local_b8,&local_60);
      CalculateQ(this,&local_d0,&local_100,&local_60,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_b8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar12) goto LAB_0056bb97;
      local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] =
           local_b8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) {
LAB_0056bbb6:
        __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                      "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                      "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, -1, 1>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, -1, 1>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (local_138.m_storage.m_rows < 0) {
LAB_0056bc32:
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
                     );
      }
      pCVar4 = this->m_Jac;
      pdVar9 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar11 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar11 < 0 && pdVar9 != (double *)0x0) {
LAB_0056bc13:
        __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                      ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                      "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                     );
      }
      lVar10 = uVar12 + local_108;
      if ((lVar10 < 0) ||
         (lVar5 = (pCVar4->m_K).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                  m_storage.m_cols, lVar5 <= lVar10)) {
LAB_0056bbf4:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                      "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      if (lVar11 != local_138.m_storage.m_rows) {
LAB_0056bbd5:
        __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                      ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                      "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                     );
      }
      if (local_138.m_storage.m_rows != 0) {
        pdVar9 = (double *)((long)pdVar9 + lVar13);
        lVar11 = 0;
        do {
          pdVar1 = local_138.m_storage.m_data + lVar11;
          pdVar2 = local_128.m_storage.m_data + lVar11;
          lVar11 = lVar11 + 1;
          *pdVar9 = (*pdVar1 - *pdVar2) * -99999.99999999999;
          pdVar9 = pdVar9 + lVar5;
        } while (local_138.m_storage.m_rows != lVar11);
      }
      if (local_e8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar12) goto LAB_0056bb97;
      local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] =
           local_e8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] +
           1e-05;
      CalculateQ(this,&local_d0,&local_100,&local_88,&local_e8,mat,(ChVectorDynamic<> *)&local_138);
      if (local_e8.super_ChVectorDynamic<double>.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows <=
          (long)uVar12) goto LAB_0056bb97;
      local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] =
           local_e8.super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[uVar12] +
           -1e-05;
      if (local_138.m_storage.m_rows != local_128.m_storage.m_rows) goto LAB_0056bbb6;
      if (local_138.m_storage.m_rows < 0) goto LAB_0056bc32;
      pCVar4 = this->m_Jac;
      pdVar9 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_data;
      lVar11 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
               m_storage.m_rows;
      if (lVar11 < 0 && pdVar9 != (double *)0x0) goto LAB_0056bc13;
      lVar5 = (pCVar4->m_R).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
              m_storage.m_cols;
      if (lVar5 <= lVar10) goto LAB_0056bbf4;
      if (lVar11 != local_138.m_storage.m_rows) goto LAB_0056bbd5;
      if (local_138.m_storage.m_rows != 0) {
        pdVar9 = (double *)((long)pdVar9 + lVar13);
        lVar11 = 0;
        do {
          pdVar1 = local_138.m_storage.m_data + lVar11;
          pdVar2 = local_128.m_storage.m_data + lVar11;
          lVar11 = lVar11 + 1;
          *pdVar9 = (*pdVar1 - *pdVar2) * -99999.99999999999;
          pdVar9 = pdVar9 + lVar5;
        } while (local_138.m_storage.m_rows != lVar11);
      }
      uVar12 = uVar12 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar12 != local_110);
  }
  if (local_138.m_storage.m_data != (double *)0x0) {
    free((void *)local_138.m_storage.m_data[-1]);
  }
  if (local_b8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_b8.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_a0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_60.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_60.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_48.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_48.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_128.m_storage.m_data != (double *)0x0) {
    free((void *)local_128.m_storage.m_data[-1]);
  }
  if (local_e8.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_e8.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_88.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_88.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_100.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_100.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  if (local_d0.super_ChVectorDynamic<double>.
      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_d0.super_ChVectorDynamic<double>.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data[-1]
        );
  }
  return;
}

Assistant:

void CalculateJacobians(const ChMaterialCompositeSMC& mat) {
        // Compute a finite-difference approximations to the Jacobians of the contact forces and
        // load dQ/dx into m_Jac->m_K and dQ/dw into m_Jac->m_R.
        // Note that we only calculate these Jacobians whenever the contact force itself is calculated,
        // that is only once per step.  The Jacobian of generalized contact forces will therefore be
        // constant over the time step.

        // Get states for objA
        int ndofA_x = this->objA->ContactableGet_ndof_x();
        int ndofA_w = this->objA->ContactableGet_ndof_w();
        ChState stateA_x(ndofA_x, NULL);
        ChStateDelta stateA_w(ndofA_w, NULL);
        this->objA->ContactableGetStateBlock_x(stateA_x);
        this->objA->ContactableGetStateBlock_w(stateA_w);

        // Get states for objB
        int ndofB_x = this->objB->ContactableGet_ndof_x();
        int ndofB_w = this->objB->ContactableGet_ndof_w();
        ChState stateB_x(ndofB_x, NULL);
        ChStateDelta stateB_w(ndofB_w, NULL);
        this->objB->ContactableGetStateBlock_x(stateB_x);
        this->objB->ContactableGetStateBlock_w(stateB_w);

        // Compute Q at current state
        ChVectorDynamic<> Q0(ndofA_w + ndofB_w);
        CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q0);

        // Finite-difference approximation perturbation.
        // Note that ChState and ChStateDelta are set to 0 on construction.
        // To accommodate objects with quaternion states, use the method ContactableIncrementState while
        // calculating Jacobian columns corresponding to position states.
        double perturbation = 1e-5;
        ChState stateA_x1(ndofA_x, NULL);
        ChState stateB_x1(ndofB_x, NULL);
        ChStateDelta prtrbA(ndofA_w, NULL);
        ChStateDelta prtrbB(ndofB_w, NULL);

        ChVectorDynamic<> Q1(ndofA_w + ndofB_w);

        // Jacobian w.r.t. variables of objA
        for (int i = 0; i < ndofA_w; i++) {
            prtrbA(i) += perturbation;
            this->objA->ContactableIncrementState(stateA_x, prtrbA, stateA_x1);
            CalculateQ(stateA_x1, stateA_w, stateB_x, stateB_w, mat, Q1);
            prtrbA(i) -= perturbation;

            m_Jac->m_K.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateA_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateA_w(i) -= perturbation;

            m_Jac->m_R.col(i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }

        // Jacobian w.r.t. variables of objB
        for (int i = 0; i < ndofB_w; i++) {
            prtrbB(i) += perturbation;
            this->objB->ContactableIncrementState(stateB_x, prtrbB, stateB_x1);
            CalculateQ(stateA_x, stateA_w, stateB_x1, stateB_w, mat, Q1);
            prtrbB(i) -= perturbation;

            m_Jac->m_K.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change

            stateB_w(i) += perturbation;
            CalculateQ(stateA_x, stateA_w, stateB_x, stateB_w, mat, Q1);
            stateB_w(i) -= perturbation;

            m_Jac->m_R.col(ndofA_w + i) = (Q1 - Q0) * (-1 / perturbation);  // note sign change
        }
    }